

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Reserve
          (RepeatedField<unsigned_int> *this,int new_size)

{
  int size;
  Arena *this_00;
  int *piVar1;
  ulong uVar2;
  unsigned_long uVar3;
  Rep *pRVar4;
  LogMessage *pLVar5;
  uint *limit;
  uint *e;
  int old_total_size;
  size_t bytes;
  byte local_131;
  LogMessage local_130;
  int local_f4;
  Arena *local_f0;
  Arena *arena;
  Rep *old_rep;
  RepeatedField<unsigned_int> *pRStack_d8;
  int new_size_local;
  RepeatedField<unsigned_int> *this_local;
  byte local_b9;
  LogMessage local_b8;
  ulong local_80;
  Arena *local_78;
  Rep *local_70;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  ulong local_18;
  Arena *local_10;
  
  if (this->total_size_ < new_size) {
    arena = (Arena *)this->rep_;
    old_rep._4_4_ = new_size;
    pRStack_d8 = this;
    local_f0 = GetArenaNoVirtual(this);
    local_f4 = this->total_size_ << 1;
    piVar1 = std::max<int>(&local_f4,(int *)((long)&old_rep + 4));
    piVar1 = std::max<int>(&internal::kMinRepeatedFieldAllocationSize,piVar1);
    old_rep._4_4_ = *piVar1;
    uVar2 = (ulong)old_rep._4_4_;
    uVar3 = std::numeric_limits<unsigned_long>::max();
    local_131 = 0;
    if (uVar3 - 8 >> 2 < uVar2) {
      internal::LogMessage::LogMessage
                (&local_130,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x538);
      local_131 = 1;
      pLVar5 = internal::LogMessage::operator<<
                         (&local_130,
                          "CHECK failed: (static_cast<size_t>(new_size)) <= ((std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element)): "
                         );
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"Requested size is too large to fit into size_t.");
      internal::LogFinisher::operator=((LogFinisher *)((long)&bytes + 3),pLVar5);
    }
    if ((local_131 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_130);
    }
    uVar2 = (long)old_rep._4_4_ * 4 + 8;
    if (local_f0 == (Arena *)0x0) {
      pRVar4 = (Rep *)operator_new(uVar2);
      this->rep_ = pRVar4;
    }
    else {
      local_78 = local_f0;
      local_80 = uVar2;
      uVar3 = std::numeric_limits<unsigned_long>::max();
      local_b9 = 0;
      if (uVar3 < uVar2) {
        internal::LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
                   ,0x1c6);
        local_b9 = 1;
        pLVar5 = internal::LogMessage::operator<<
                           (&local_b8,
                            "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                           );
        pLVar5 = internal::LogMessage::operator<<
                           (pLVar5,"Requested size is too large to fit into size_t.");
        internal::LogFinisher::operator=((LogFinisher *)((long)&this_local + 3),pLVar5);
      }
      if ((local_b9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_b8);
      }
      this_00 = local_78;
      uVar2 = local_80;
      if (local_78 == (Arena *)0x0) {
        local_70 = (Rep *)operator_new__(local_80);
      }
      else {
        local_10 = local_78;
        local_18 = local_80;
        uVar3 = std::numeric_limits<unsigned_long>::max();
        local_51 = 0;
        if (uVar3 < uVar2) {
          internal::LogMessage::LogMessage
                    (&local_50,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
                     ,0x28c);
          local_51 = 1;
          pLVar5 = internal::LogMessage::operator<<
                             (&local_50,
                              "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                             );
          pLVar5 = internal::LogMessage::operator<<
                             (pLVar5,"Requested size is too large to fit into size_t.");
          internal::LogFinisher::operator=(local_65,pLVar5);
        }
        if ((local_51 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_50);
        }
        local_70 = (Rep *)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,local_18);
      }
      this->rep_ = local_70;
    }
    this->rep_->arena = local_f0;
    size = this->total_size_;
    this->total_size_ = old_rep._4_4_;
    for (limit = this->rep_->elements; limit < this->rep_->elements + this->total_size_;
        limit = limit + 1) {
    }
    if (0 < this->current_size_) {
      MoveArray(this,this->rep_->elements,(uint *)(arena + 8),this->current_size_);
    }
    InternalDeallocate(this,(Rep *)arena,size);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = rep_;
  Arena* arena = GetArenaNoVirtual();
  new_size = std::max(google::protobuf::internal::kMinRepeatedFieldAllocationSize,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes = kRepHeaderSize + sizeof(Element) * new_size;
  if (arena == NULL) {
    rep_ = static_cast<Rep*>(::operator new(bytes));
  } else {
    rep_ = reinterpret_cast<Rep*>(
            ::google::protobuf::Arena::CreateArray<char>(arena, bytes));
  }
  rep_->arena = arena;
  int old_total_size = total_size_;
  total_size_ = new_size;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &rep_->elements[0];
  Element* limit = &rep_->elements[total_size_];
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(rep_->elements, old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}